

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::MergeFrom
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  int iVar1;
  
  if (other->current_size_ != 0) {
    iVar1 = this->current_size_;
    Reserve(this,other->current_size_ + iVar1);
    this->current_size_ = this->current_size_ + other->current_size_;
    memcpy((void *)((long)iVar1 * 8 + (long)this->arena_or_elements_),other->arena_or_elements_,
           (long)other->current_size_ << 3);
    return;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    int existing_size = size();
    Reserve(existing_size + other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(existing_size), &other.Get(0), other.size());
  }
}